

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall
ipx::Model::EvaluateBasicSolution
          (Model *this,Vector *x_solver,Vector *y_solver,Vector *z_solver,
          vector<int,_std::allocator<int>_> *basic_status_solver,Info *info)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  pointer pcVar4;
  ulong uVar5;
  char cVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  Vector xinfeas;
  Vector slack;
  Vector x;
  Vector zinfeas;
  Vector yinfeas;
  Vector sinfeas;
  Vector z;
  Vector y;
  vector<int,_std::allocator<int>_> vbasis;
  vector<int,_std::allocator<int>_> cbasis;
  _Vector_base<int,_std::allocator<int>_> local_60;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  std::valarray<double>::valarray(&x,(long)this->num_var_);
  std::valarray<double>::valarray(&slack,(long)this->num_constr_);
  std::valarray<double>::valarray(&y,(long)this->num_constr_);
  std::valarray<double>::valarray(&z,(long)this->num_var_);
  std::vector<int,_std::allocator<int>_>::vector
            (&cbasis,(long)this->num_constr_,(allocator_type *)&vbasis);
  std::vector<int,_std::allocator<int>_>::vector
            (&vbasis,(long)this->num_var_,(allocator_type *)&xinfeas);
  DualizeBackBasicSolution(this,x_solver,y_solver,z_solver,&x,&slack,&y,&z);
  DualizeBackBasis(this,basic_status_solver,&cbasis,&vbasis);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_60,&cbasis);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,&vbasis);
  CorrectScaledBasicSolution
            (this,&x,&slack,&y,&z,(vector<int,_std::allocator<int>_> *)&local_60,
             (vector<int,_std::allocator<int>_> *)&local_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_60);
  dVar8 = Dot(&this->scaled_obj_,&x);
  std::valarray<double>::valarray(&xinfeas,(long)this->num_var_);
  std::valarray<double>::valarray(&sinfeas,(long)this->num_constr_);
  std::valarray<double>::valarray(&yinfeas,(long)this->num_constr_);
  std::valarray<double>::valarray(&zinfeas,(long)this->num_var_);
  pdVar2 = (this->scaled_lbuser_)._M_data;
  pdVar3 = (this->scaled_ubuser_)._M_data;
  uVar7 = 0;
  uVar5 = (ulong)(uint)this->num_var_;
  if (this->num_var_ < 1) {
    uVar5 = uVar7;
  }
  do {
    if (uVar5 * 4 == uVar7) {
      pcVar4 = (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = 0;
      uVar5 = (ulong)(uint)this->num_constr_;
      if (this->num_constr_ < 1) {
        uVar5 = uVar7;
      }
      for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
        cVar6 = pcVar4[uVar7];
        if (cVar6 == '<') {
          if (slack._M_data[uVar7] < 0.0) {
            sinfeas._M_data[uVar7] = slack._M_data[uVar7];
          }
          if (0.0 < y._M_data[uVar7]) {
            yinfeas._M_data[uVar7] = y._M_data[uVar7];
          }
          cVar6 = pcVar4[uVar7];
        }
        if (cVar6 == '>') {
          if (0.0 < slack._M_data[uVar7]) {
            sinfeas._M_data[uVar7] = slack._M_data[uVar7];
          }
          if (y._M_data[uVar7] < 0.0) {
            yinfeas._M_data[uVar7] = y._M_data[uVar7];
          }
        }
      }
      ScaleBackBasicSolution(this,&x,&slack,&y,&z);
      ScaleBackBasicSolution(this,&xinfeas,&sinfeas,&yinfeas,&zinfeas);
      dVar9 = Infnorm(&xinfeas);
      dVar10 = Infnorm(&sinfeas);
      if (dVar10 <= dVar9) {
        dVar10 = dVar9;
      }
      (info->super_ipx_info).primal_infeas = dVar10;
      dVar9 = Infnorm(&zinfeas);
      dVar10 = Infnorm(&yinfeas);
      if (dVar10 <= dVar9) {
        dVar10 = dVar9;
      }
      (info->super_ipx_info).dual_infeas = dVar10;
      (info->super_ipx_info).objval = dVar8;
      operator_delete(zinfeas._M_data);
      operator_delete(yinfeas._M_data);
      operator_delete(sinfeas._M_data);
      operator_delete(xinfeas._M_data);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&vbasis.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&cbasis.super__Vector_base<int,_std::allocator<int>_>);
      operator_delete(z._M_data);
      operator_delete(y._M_data);
      operator_delete(slack._M_data);
      operator_delete(x._M_data);
      return;
    }
    dVar10 = *(double *)((long)x._M_data + uVar7 * 2);
    dVar9 = *(double *)((long)pdVar2 + uVar7 * 2);
    if (dVar10 < dVar9) {
      *(double *)((long)xinfeas._M_data + uVar7 * 2) = dVar10 - dVar9;
      dVar10 = *(double *)((long)x._M_data + uVar7 * 2);
    }
    dVar9 = *(double *)((long)pdVar3 + uVar7 * 2);
    if (dVar9 < dVar10) {
      *(double *)((long)xinfeas._M_data + uVar7 * 2) = dVar10 - dVar9;
    }
    iVar1 = *(int *)((long)vbasis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar7);
    if (iVar1 == -1) {
LAB_0038a319:
      dVar10 = *(double *)((long)z._M_data + uVar7 * 2);
      if (dVar10 < 0.0) {
        *(double *)((long)zinfeas._M_data + uVar7 * 2) = dVar10;
      }
    }
    else {
      dVar10 = *(double *)((long)z._M_data + uVar7 * 2);
      if (0.0 < dVar10) {
        *(double *)((long)zinfeas._M_data + uVar7 * 2) = dVar10;
      }
      if (iVar1 != -2) goto LAB_0038a319;
    }
    uVar7 = uVar7 + 4;
  } while( true );
}

Assistant:

void Model::EvaluateBasicSolution(const Vector& x_solver,
                                  const Vector& y_solver,
                                  const Vector& z_solver,
                                  const std::vector<Int>& basic_status_solver,
                                  Info* info) const {
    const Int m = rows();
    const Int n = cols();
    assert((Int)x_solver.size() == n+m);
    assert((Int)y_solver.size() == m);
    assert((Int)z_solver.size() == n+m);
    assert((Int)basic_status_solver.size() == n+m);

    // Build basic solution to scaled user model.
    Vector x(num_var_);
    Vector slack(num_constr_);
    Vector y(num_constr_);
    Vector z(num_var_);
    std::vector<Int> cbasis(num_constr_);
    std::vector<Int> vbasis(num_var_);
    DualizeBackBasicSolution(x_solver, y_solver, z_solver, x, slack, y, z);
    DualizeBackBasis(basic_status_solver, cbasis, vbasis);
    CorrectScaledBasicSolution(x, slack, y, z, cbasis, vbasis);
    double pobj = Dot(scaled_obj_, x);

    // Build infeasibilities in scaled user model.
    Vector xinfeas(num_var_);
    Vector sinfeas(num_constr_);
    Vector yinfeas(num_constr_);
    Vector zinfeas(num_var_);
    for (Int j = 0; j < num_var_; j++) {
        if (x[j] < scaled_lbuser_[j])
            xinfeas[j] = x[j]-scaled_lbuser_[j];
        if (x[j] > scaled_ubuser_[j])
            xinfeas[j] = x[j]-scaled_ubuser_[j];
        if (vbasis[j] != IPX_nonbasic_lb && z[j] > 0.0)
            zinfeas[j] = z[j];
        if (vbasis[j] != IPX_nonbasic_ub && z[j] < 0.0)
            zinfeas[j] = z[j];
    }
    for (Int i = 0; i < num_constr_; i++) {
        if (constr_type_[i] == '<') {
            if (slack[i] < 0.0)
                sinfeas[i] = slack[i];
            if (y[i] > 0.0)
                yinfeas[i] = y[i];
        }
        if (constr_type_[i] == '>') {
            if (slack[i] > 0.0)
                sinfeas[i] = slack[i];
            if (y[i] < 0.0)
                yinfeas[i] = y[i];
        }
    }

    // Scale back basic solution and infeasibilities.
    ScaleBackBasicSolution(x, slack, y, z);
    ScaleBackBasicSolution(xinfeas, sinfeas, yinfeas, zinfeas);

    info->primal_infeas = std::max(Infnorm(xinfeas), Infnorm(sinfeas));
    info->dual_infeas = std::max(Infnorm(zinfeas), Infnorm(yinfeas));
    info->objval = pobj;
}